

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<ninx::parser::element::IfStatement,_std::default_delete<ninx::parser::element::IfStatement>_>
 __thiscall ninx::parser::Parser::parse_if_statement(Parser *this)

{
  TokenReader *this_00;
  int iVar1;
  undefined8 extraout_RAX;
  Parser *in_RSI;
  _Alloc_hider local_90;
  _Alloc_hider local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [24];
  _Head_base<0UL,_ninx::parser::element::Expression_*,_false> local_60;
  vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  cases;
  
  this_00 = &in_RSI->reader;
  local_78._16_8_ = this;
  iVar1 = TokenReader::check_type(this_00,IF);
  if (iVar1 == 1) {
    TokenReader::get_token(this_00);
    cases.
    super__Vector_base<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cases.
    super__Vector_base<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cases.
    super__Vector_base<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    parse_level_3_expression((Parser *)local_80);
    parse_block((Parser *)(local_78 + 8));
    std::
    make_unique<ninx::parser::element::IfCase,std::unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>>
              ((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                *)local_78,
               (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                *)local_80);
    std::
    vector<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>,std::allocator<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>>
    ::
    emplace_back<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>
              ((vector<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>,std::allocator<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>>
                *)&cases,
               (unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>
                *)local_78);
    while( true ) {
      iVar1 = TokenReader::check_type(this_00,ELSEIF);
      if (iVar1 != 1) break;
      TokenReader::get_token(this_00);
      parse_level_3_expression((Parser *)&local_90);
      parse_block((Parser *)&local_88);
      std::
      make_unique<ninx::parser::element::IfCase,std::unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>>
                ((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                  *)&local_60,
                 (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                  *)&local_90);
      std::
      vector<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>,std::allocator<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>>
      ::
      emplace_back<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>
                ((vector<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>,std::allocator<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>>
                  *)&cases,
                 (unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>
                  *)&local_60);
      if (local_60._M_head_impl != (Expression *)0x0) {
        (*(code *)(((_Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                     *)&(local_60._M_head_impl)->super_Statement)->_M_impl).super__Vector_impl_data.
                  _M_start[1]._M_t)();
      }
      if ((long *)local_88._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_88._M_p + 8))();
      }
      if ((long *)local_90._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_90._M_p + 8))();
      }
    }
    local_90._M_p = (pointer)0x0;
    iVar1 = TokenReader::check_type(this_00,ELSE);
    if (iVar1 == 1) {
      TokenReader::get_token(this_00);
      parse_block((Parser *)&local_88);
      local_90._M_p = local_88._M_p;
    }
    std::
    make_unique<ninx::parser::element::IfStatement,std::vector<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>,std::allocator<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>>,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>>
              ((vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
                *)local_78._16_8_,
               (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                *)&cases);
    if ((long *)local_90._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_90._M_p + 8))();
    }
    if ((Expression *)local_78._0_8_ != (Expression *)0x0) {
      (**(code **)(*(long *)local_78._0_8_ + 8))();
    }
    if ((long *)local_78._8_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_78._8_8_ + 8))();
    }
    if (local_80 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
    std::
    vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
    ::~vector(&cases);
    return (__uniq_ptr_data<ninx::parser::element::IfStatement,_std::default_delete<ninx::parser::element::IfStatement>,_true,_true>
            )(tuple<ninx::parser::element::IfStatement_*,_std::default_delete<ninx::parser::element::IfStatement>_>
              )local_78._16_8_;
  }
  std::__cxx11::string::string((string *)&cases,"Expected If statement",(allocator *)local_80);
  generate_exception(in_RSI,(string *)&cases);
  if ((_Head_base<0UL,_ninx::parser::element::Expression_*,_false>)local_78._0_8_ !=
      (_Head_base<0UL,_ninx::parser::element::Expression_*,_false>)0x0) {
    (**(code **)(*(long *)local_78._0_8_ + 8))();
  }
  if ((long *)local_78._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_78._8_8_ + 8))();
  }
  if (local_80 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_80 + 8))();
  }
  std::
  vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  ::~vector(&cases);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::unique_ptr<IfStatement> ninx::parser::Parser::parse_if_statement() {
    if (reader.check_type(Type::IF) != 1) {
        generate_exception("Expected If statement");
    }
    reader.get_token();

    std::vector<std::unique_ptr<IfCase>> cases;

    // Parse the main condition
    auto condition {parse_expression()};
    auto body {parse_block()};
    auto main_case = std::make_unique<IfCase>(std::move(condition), std::move(body));
    cases.push_back(std::move(main_case));

    // Parse optional else if statements
    while(reader.check_type(Type::ELSEIF) == 1) {
        reader.get_token();

        auto elseif_condition {parse_expression()};
        auto elseif_body {parse_block()};
        auto elseif_case = std::make_unique<IfCase>(std::move(elseif_condition), std::move(elseif_body));
        cases.push_back(std::move(elseif_case));
    }

    // Parse optional else statement
    std::unique_ptr<Block> else_body {nullptr};
    if (reader.check_type(Type::ELSE) == 1){
        reader.get_token();

        else_body = parse_block();
    }


    auto if_condition = std::make_unique<IfStatement>(std::move(cases), std::move(else_body));

    return if_condition;
}